

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O0

void __thiscall
RecoveryTest_PureVirtualMethodCallTest_Test::TestBody
          (RecoveryTest_PureVirtualMethodCallTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  exception *gtest_exception;
  ReturnSentinel local_100;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> local_f0;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_d8;
  DeathTest *gtest_dt;
  RE *local_40;
  RE *gtest_regex;
  char regex [31];
  RecoveryTest_PureVirtualMethodCallTest_Test *this_local;
  
  gtest_regex = (RE *)0x6172437869736f50;
  builtin_strncpy(regex,"shHandler::handleCrash",0x17);
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_00111011;
  testing::internal::RE::RE((RE *)&gtest_dt,(char *)&gtest_regex);
  local_40 = (RE *)&gtest_dt;
  bVar2 = testing::internal::DeathTest::Create
                    ("Derived()",(RE *)&gtest_dt,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x32,&local_d8);
  if (bVar2) {
    if (local_d8 != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr(&local_f0,local_d8);
      iVar3 = (*local_d8->_vptr_DeathTest[2])();
      pDVar1 = local_d8;
      if (iVar3 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled((ExitedOrKilled *)&gtest_sentinel,3,0xb);
        iVar3 = (*local_d8->_vptr_DeathTest[3])();
        bVar2 = extensions::ExitedOrKilled::operator()((ExitedOrKilled *)&gtest_sentinel,iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_00110fa3;
        local_13c = 2;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_100,local_d8);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            Derived::Derived((Derived *)&gtest_exception);
            Derived::~Derived((Derived *)&gtest_exception);
          }
          (*local_d8->_vptr_DeathTest[5])(local_d8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_100);
        }
LAB_00110fa3:
        local_13c = 0;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&local_f0);
      if (local_13c != 0) goto LAB_00110fdf;
    }
    local_13c = 0;
  }
  else {
    local_13c = 2;
  }
LAB_00110fdf:
  testing::internal::RE::~RE((RE *)&gtest_dt);
  if (local_13c == 0) {
    return;
  }
LAB_00111011:
  testing::Message::Message(&local_148);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_150,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x32,message);
  testing::internal::AssertHelper::operator=(&local_150,&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_150);
  testing::Message::~Message(&local_148);
  return;
}

Assistant:

TEST_F (RecoveryTest, PureVirtualMethodCallTest) {
#ifdef _WIN32
    const char regex[] = "::PureCallHandler";
#else
    const char regex[] = "PosixCrashHandler::handleCrash";
#endif
    
    ASSERT_EXIT(Derived(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}